

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InferenceEngine.cpp
# Opt level: O0

void __thiscall Inferences::CompositeSGI::detach(CompositeSGI *this)

{
  GeneratingInferenceEngine **ppGVar1;
  SimplifyingGeneratingInference **ppSVar2;
  long in_RDI;
  SimplifyingGeneratingInference *s;
  SimplifyingGeneratingInference **__end1_1;
  SimplifyingGeneratingInference **__begin1_1;
  Stack<Inferences::SimplifyingGeneratingInference_*> *__range1_1;
  GeneratingInferenceEngine *g;
  GeneratingInferenceEngine **__end1;
  GeneratingInferenceEngine **__begin1;
  Stack<Inferences::GeneratingInferenceEngine_*> *__range1;
  SimplifyingGeneratingInference **local_38;
  GeneratingInferenceEngine **local_18;
  
  local_18 = Lib::Stack<Inferences::GeneratingInferenceEngine_*>::begin
                       ((Stack<Inferences::GeneratingInferenceEngine_*> *)(in_RDI + 0x30));
  ppGVar1 = Lib::Stack<Inferences::GeneratingInferenceEngine_*>::end
                      ((Stack<Inferences::GeneratingInferenceEngine_*> *)(in_RDI + 0x30));
  for (; local_18 != ppGVar1; local_18 = local_18 + 1) {
    (*((*local_18)->super_SimplifyingGeneratingInference).super_InferenceEngine.
      _vptr_InferenceEngine[3])();
  }
  local_38 = Lib::Stack<Inferences::SimplifyingGeneratingInference_*>::begin
                       ((Stack<Inferences::SimplifyingGeneratingInference_*> *)(in_RDI + 0x10));
  ppSVar2 = Lib::Stack<Inferences::SimplifyingGeneratingInference_*>::end
                      ((Stack<Inferences::SimplifyingGeneratingInference_*> *)(in_RDI + 0x10));
  for (; local_38 != ppSVar2; local_38 = local_38 + 1) {
    (*((*local_38)->super_InferenceEngine)._vptr_InferenceEngine[3])();
  }
  return;
}

Assistant:

void CompositeSGI::detach()
{ 
  for (auto g : _generators) {
    g->detach();
  }
  for (auto s : _simplifiers) {
    s->detach();
  }
}